

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

NormalBlockISEInputs *
tcu::astc::anon_unknown_0::generateDefaultISEInputs
          (NormalBlockISEInputs *__return_storage_ptr__,NormalBlockParams *blockParams)

{
  deUint32 dVar1;
  NormalBlockISEInputs *result;
  int i_3;
  int colorEndpointRangeMax;
  ISEParams *local_38;
  ISEParams *colorEndpointISEParams;
  int local_28;
  int numBitsForColorEndpoints;
  int numColorEndpointValues;
  int i_2;
  int i_1;
  int i;
  int weightRangeMax;
  int numWeights;
  NormalBlockParams *blockParams_local;
  
  _weightRangeMax = blockParams;
  NormalBlockISEInputs::NormalBlockISEInputs(__return_storage_ptr__);
  (__return_storage_ptr__->weight).isGivenInBlockForm = false;
  i = computeNumWeights(_weightRangeMax);
  i_1 = computeISERangeMax(&_weightRangeMax->weightISEParams);
  if ((_weightRangeMax->isDualPlane & 1U) == 0) {
    for (numBitsForColorEndpoints = 0; numBitsForColorEndpoints < i;
        numBitsForColorEndpoints = numBitsForColorEndpoints + 1) {
      *(int *)((long)&(__return_storage_ptr__->weight).value + (long)numBitsForColorEndpoints * 4) =
           (numBitsForColorEndpoints * i_1 + (i + -1) / 2) / (i + -1);
    }
  }
  else {
    for (i_2 = 0; i_2 < i; i_2 = i_2 + 2) {
      *(int *)((long)&(__return_storage_ptr__->weight).value + (long)i_2 * 4) =
           (i_2 * i_1 + (i + -1) / 2) / (i + -1);
    }
    for (numColorEndpointValues = 1; numColorEndpointValues < i;
        numColorEndpointValues = numColorEndpointValues + 2) {
      *(int *)((long)&(__return_storage_ptr__->weight).value + (long)numColorEndpointValues * 4) =
           i_1 - (numColorEndpointValues * i_1 + (i + -1) / 2) / (i + -1);
    }
  }
  (__return_storage_ptr__->endpoint).isGivenInBlockForm = false;
  local_28 = computeNumColorEndpointValues
                       (_weightRangeMax->colorEndpointModes,_weightRangeMax->numPartitions,
                        (bool)(_weightRangeMax->isMultiPartSingleCemMode & 1));
  colorEndpointISEParams._4_4_ = computeNumBitsForColorEndpoints(_weightRangeMax);
  _i_3 = computeMaximumRangeISEParams(colorEndpointISEParams._4_4_,local_28);
  local_38 = (ISEParams *)&i_3;
  dVar1 = computeISERangeMax(local_38);
  for (result._0_4_ = 0; (int)result < local_28; result._0_4_ = (int)result + 1) {
    *(int *)((long)&(__return_storage_ptr__->endpoint).value + (long)(int)result * 4) =
         (int)((int)result * dVar1 + (local_28 + -1) / 2) / (local_28 + -1);
  }
  return __return_storage_ptr__;
}

Assistant:

static NormalBlockISEInputs generateDefaultISEInputs (const NormalBlockParams& blockParams)
{
	NormalBlockISEInputs result;

	{
		result.weight.isGivenInBlockForm = false;

		const int numWeights		= computeNumWeights(blockParams);
		const int weightRangeMax	= computeISERangeMax(blockParams.weightISEParams);

		if (blockParams.isDualPlane)
		{
			for (int i = 0; i < numWeights; i += 2)
				result.weight.value.plain[i] = (i*weightRangeMax + (numWeights-1)/2) / (numWeights-1);

			for (int i = 1; i < numWeights; i += 2)
				result.weight.value.plain[i] = weightRangeMax - (i*weightRangeMax + (numWeights-1)/2) / (numWeights-1);
		}
		else
		{
			for (int i = 0; i < numWeights; i++)
				result.weight.value.plain[i] = (i*weightRangeMax + (numWeights-1)/2) / (numWeights-1);
		}
	}

	{
		result.endpoint.isGivenInBlockForm = false;

		const int			numColorEndpointValues		= computeNumColorEndpointValues(&blockParams.colorEndpointModes[0], blockParams.numPartitions, blockParams.isMultiPartSingleCemMode);
		const int			numBitsForColorEndpoints	= computeNumBitsForColorEndpoints(blockParams);
		const ISEParams&	colorEndpointISEParams		= computeMaximumRangeISEParams(numBitsForColorEndpoints, numColorEndpointValues);
		const int			colorEndpointRangeMax		= computeISERangeMax(colorEndpointISEParams);

		for (int i = 0; i < numColorEndpointValues; i++)
			result.endpoint.value.plain[i] = (i*colorEndpointRangeMax + (numColorEndpointValues-1)/2) / (numColorEndpointValues-1);
	}

	return result;
}